

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void printVectors(int argc,char **argv)

{
  char *pcVar1;
  long in_RSI;
  int in_EDI;
  FastText fasttext;
  string *in_stack_00000178;
  FastText *in_stack_00000180;
  FastText *in_stack_ffffffffffffff50;
  FastText *this;
  undefined1 local_91 [129];
  long local_10;
  
  if (in_EDI != 3) {
    printPrintVectorsUsage();
    exit(1);
  }
  local_10 = in_RSI;
  ::fasttext::FastText::FastText(in_stack_ffffffffffffff50);
  pcVar1 = *(char **)(local_10 + 0x10);
  this = (FastText *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_91 + 1),pcVar1,(allocator *)this);
  ::fasttext::FastText::loadModel(in_stack_00000180,in_stack_00000178);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  ::fasttext::FastText::printVectors(this);
  exit(0);
}

Assistant:

void printVectors(int argc, char** argv) {
  if (argc != 3) {
    printPrintVectorsUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(argv[2]));
  fasttext.printVectors();
  exit(0);
}